

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_bbdpre.c
# Opt level: O3

int ARKBBDPrecGetNumGfnEvals(void *arkode_mem,long *ngevalsBBDP)

{
  int iVar1;
  ARKLsMem arkls_mem;
  ARKodeMem ark_mem;
  ARKLsMem local_20;
  ARKodeMem local_18;
  
  iVar1 = arkLs_AccessARKODELMem(arkode_mem,"ARKBBDPrecGetNumGfnEvals",&local_18,&local_20);
  if (iVar1 == 0) {
    if (local_20->P_data == (void *)0x0) {
      iVar1 = -5;
      arkProcessError(local_18,-5,0x173,"ARKBBDPrecGetNumGfnEvals",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_bbdpre.c"
                      ,"BBD peconditioner memory is NULL. ARKBBDPrecInit must be called.");
    }
    else {
      *ngevalsBBDP = *(long *)((long)local_20->P_data + 0x90);
      iVar1 = 0;
    }
  }
  return iVar1;
}

Assistant:

int ARKBBDPrecGetNumGfnEvals(void* arkode_mem, long int* ngevalsBBDP)
{
  ARKodeMem ark_mem;
  ARKLsMem arkls_mem;
  ARKBBDPrecData pdata;
  int retval;

  /* access ARKodeMem and ARKLsMem structure */
  retval = arkLs_AccessARKODELMem(arkode_mem, __func__, &ark_mem, &arkls_mem);
  if (retval != ARK_SUCCESS) { return (retval); }

  /* Return immediately if ARKBBDPrecData is NULL */
  if (arkls_mem->P_data == NULL)
  {
    arkProcessError(ark_mem, ARKLS_PMEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_BBD_PMEM_NULL);
    return (ARKLS_PMEM_NULL);
  }
  pdata = (ARKBBDPrecData)arkls_mem->P_data;

  /* set output */
  *ngevalsBBDP = pdata->nge;

  return (ARKLS_SUCCESS);
}